

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O1

Reader __thiscall
capnp::_::PointerReader::getBlob<capnp::Data>
          (PointerReader *this,void *defaultValue,ByteCount defaultSize)

{
  WirePointer *pWVar1;
  SegmentReader *pSVar2;
  word *pwVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  int iVar8;
  undefined4 extraout_var;
  long lVar10;
  undefined4 in_register_00000014;
  long lVar11;
  ulong uVar12;
  undefined8 extraout_RDX;
  ulong extraout_RDX_00;
  long extraout_RDX_01;
  ulong extraout_RDX_02;
  ulong extraout_RDX_03;
  ulong extraout_RDX_04;
  undefined8 extraout_RDX_05;
  undefined8 extraout_RDX_06;
  undefined8 uVar13;
  uint uVar14;
  ulong uVar15;
  WirePointer *pWVar16;
  ulong uVar17;
  WirePointer *pWVar18;
  WirePointer *pWVar19;
  bool bVar20;
  undefined1 auVar21 [16];
  Reader RVar22;
  ThrowOverflow local_39;
  WirePointer *local_38;
  undefined8 *puVar9;
  
  lVar11 = CONCAT44(in_register_00000014,defaultSize);
  pSVar2 = this->segment;
  pWVar16 = (WirePointer *)&(anonymous_namespace)::zero;
  if (this->pointer != (WirePointer *)0x0) {
    pWVar16 = this->pointer;
  }
  if (0x1fffffff < defaultSize) {
    kj::ThrowOverflow::operator()(&local_39);
    lVar11 = extraout_RDX_01;
  }
  pWVar18 = pWVar16 + 1;
  lVar10 = (long)((int)(pWVar16->offsetAndKind).value >> 2);
  if (pSVar2 == (SegmentReader *)0x0) {
    pWVar19 = pWVar18 + lVar10;
  }
  else {
    pwVar3 = (pSVar2->ptr).ptr;
    pWVar19 = (WirePointer *)(pwVar3 + (pSVar2->ptr).size_);
    lVar11 = (long)pwVar3 - (long)pWVar18 >> 3;
    if (lVar11 <= lVar10) {
      lVar11 = (long)pWVar19 - (long)pWVar18 >> 3;
      if (lVar10 <= lVar11) {
        pWVar19 = pWVar18 + lVar10;
      }
    }
  }
  auVar4._8_8_ = lVar11;
  auVar4._0_8_ = pSVar2;
  auVar21._8_8_ = lVar11;
  auVar21._0_8_ = pSVar2;
  uVar14 = (pWVar16->offsetAndKind).value;
  if ((pWVar16->field_1).upper32Bits != 0 || uVar14 != 0) {
    pWVar18 = pWVar16;
    if ((pSVar2 != (SegmentReader *)0x0) && (auVar21 = auVar4, (uVar14 & 3) == 2)) {
      iVar8 = (*pSVar2->arena->_vptr_Arena[2])();
      puVar9 = (undefined8 *)CONCAT44(extraout_var,iVar8);
      if (puVar9 == (undefined8 *)0x0) {
        getBlob<capnp::Data>();
        auVar7._8_8_ = 0;
        auVar7._0_8_ = extraout_RDX_04;
        pWVar19 = (WirePointer *)0x0;
        auVar21 = auVar7 << 0x40;
      }
      else {
        uVar14 = (pWVar16->offsetAndKind).value;
        uVar17 = (ulong)(uVar14 >> 3);
        uVar12 = puVar9[3];
        if ((long)uVar12 < (long)uVar17) {
          uVar17 = uVar12;
        }
        uVar15 = 2 - (ulong)((uVar14 & 4) == 0);
        local_38 = (WirePointer *)defaultValue;
        if (uVar15 + uVar17 <= uVar12) {
          pWVar18 = (WirePointer *)(uVar17 * 8 + puVar9[2]);
          uVar12 = *(ulong *)puVar9[4];
          if (uVar15 <= uVar12) {
            *(ulong *)puVar9[4] = uVar12 - uVar15;
            pWVar1 = pWVar18 + 1;
            if (((pWVar16->offsetAndKind).value & 4) == 0) {
              lVar10 = (long)((int)(pWVar18->offsetAndKind).value >> 2);
              lVar11 = puVar9[3];
              auVar6._8_8_ = lVar11;
              auVar6._0_8_ = puVar9;
              auVar5._8_8_ = lVar11;
              auVar5._0_8_ = puVar9;
              auVar21._8_8_ = lVar11;
              auVar21._0_8_ = puVar9;
              pWVar19 = (WirePointer *)(puVar9[2] + lVar11 * 8);
              if ((puVar9[2] - (long)pWVar1 >> 3 <= lVar10) &&
                 (auVar21 = auVar5, lVar10 <= (long)pWVar19 - (long)pWVar1 >> 3)) {
                pWVar19 = pWVar1 + lVar10;
                auVar21 = auVar6;
              }
            }
            else {
              auVar21 = (**(code **)(*(long *)*puVar9 + 0x10))
                                  ((long *)*puVar9,(pWVar18->field_1).upper32Bits);
              lVar11 = auVar21._0_8_;
              if (lVar11 == 0) {
                getBlob<capnp::Data>();
                uVar13 = extraout_RDX_05;
              }
              else {
                uVar14 = (pWVar18->offsetAndKind).value;
                if ((uVar14 & 3) == 2) {
                  uVar12 = (ulong)(uVar14 >> 3);
                  if ((long)*(ulong *)(lVar11 + 0x18) < (long)uVar12) {
                    uVar12 = *(ulong *)(lVar11 + 0x18);
                  }
                  pWVar18 = pWVar1;
                  defaultValue = local_38;
                  pWVar19 = (WirePointer *)(uVar12 * 8 + *(long *)(lVar11 + 0x10));
                  goto LAB_0027e0c4;
                }
                getBlob<capnp::Data>();
                uVar13 = extraout_RDX_06;
              }
              auVar21._8_8_ = uVar13;
              auVar21._0_8_ = puVar9;
              pWVar18 = pWVar1;
              defaultValue = local_38;
              pWVar19 = (WirePointer *)0x0;
            }
            goto LAB_0027e0c4;
          }
          (**(code **)(*(long *)*puVar9 + 0x18))();
        }
        getBlob<capnp::Data>();
        auVar21._8_8_ = extraout_RDX;
        auVar21._0_8_ = puVar9;
        pWVar18 = pWVar16;
        defaultValue = local_38;
        pWVar19 = (WirePointer *)0x0;
      }
    }
LAB_0027e0c4:
    uVar12 = auVar21._8_8_;
    puVar9 = auVar21._0_8_;
    bVar20 = pWVar19 == (WirePointer *)0x0;
    if (!bVar20) {
      if (((pWVar18->offsetAndKind).value & 3) == 1) {
        if (((pWVar18->field_1).upper32Bits & 7) == 2) {
          uVar14 = (pWVar18->field_1).upper32Bits >> 3;
          if (puVar9 == (undefined8 *)0x0) {
LAB_0027e12d:
            uVar12 = (ulong)uVar14;
            bVar20 = false;
            goto LAB_0027e144;
          }
          uVar12 = (ulong)(uVar14 + 7 >> 3);
          if (((long)pWVar19 - puVar9[2] >> 3) + uVar12 <= (ulong)puVar9[3]) {
            uVar17 = *(ulong *)puVar9[4];
            if (uVar12 <= uVar17) {
              *(ulong *)puVar9[4] = uVar17 - uVar12;
              goto LAB_0027e12d;
            }
            (**(code **)(*(long *)*puVar9 + 0x18))();
          }
          getBlob<capnp::Data>();
          uVar12 = extraout_RDX_00;
        }
        else {
          getBlob<capnp::Data>();
          uVar12 = extraout_RDX_03;
        }
      }
      else {
        getBlob<capnp::Data>();
        uVar12 = extraout_RDX_02;
      }
      bVar20 = true;
    }
LAB_0027e144:
    if (!bVar20) goto LAB_0027e14d;
  }
  uVar12 = (ulong)defaultSize;
  pWVar19 = (WirePointer *)defaultValue;
LAB_0027e14d:
  RVar22.super_ArrayPtr<const_unsigned_char>.size_ = uVar12;
  RVar22.super_ArrayPtr<const_unsigned_char>.ptr = (uchar *)pWVar19;
  return (Reader)RVar22.super_ArrayPtr<const_unsigned_char>;
}

Assistant:

Data::Reader PointerReader::getBlob<Data>(const void* defaultValue, ByteCount defaultSize) const {
  const WirePointer* ref = pointer == nullptr ? &zero.pointer : pointer;
  return WireHelpers::readDataPointer(segment, ref, defaultValue,
      assertMaxBits<BLOB_SIZE_BITS>(defaultSize, ThrowOverflow()));
}